

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode LocalizedText_encodeBinary(UA_LocalizedText *src,UA_DataType *_)

{
  UA_Byte *pUVar1;
  UA_Byte *pUVar2;
  UA_StatusCode UVar3;
  UA_Byte UVar4;
  UA_StatusCode UVar5;
  
  pUVar1 = (src->locale).data;
  pUVar2 = (src->text).data;
  UVar5 = 0x80080000;
  if (pos + 1 <= end) {
    UVar4 = (pUVar1 != (UA_Byte *)0x0) + '\x02';
    if (pUVar2 == (UA_Byte *)0x0) {
      UVar4 = pUVar1 != (UA_Byte *)0x0;
    }
    *pos = UVar4;
    pos = pos + 1;
    UVar5 = 0;
  }
  if (pUVar1 != (UA_Byte *)0x0) {
    UVar3 = Array_encodeBinary((src->locale).data,(src->locale).length,UA_TYPES + 2);
    UVar5 = UVar5 | UVar3;
  }
  if (pUVar2 != (UA_Byte *)0x0) {
    UVar3 = Array_encodeBinary((src->text).data,(src->text).length,UA_TYPES + 2);
    UVar5 = UVar5 | UVar3;
  }
  return UVar5;
}

Assistant:

static UA_StatusCode
LocalizedText_encodeBinary(UA_LocalizedText const *src, const UA_DataType *_) {
    /* Set up the encoding mask */
    UA_Byte encoding = 0;
    if(src->locale.data)
        encoding |= UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE;
    if(src->text.data)
        encoding |= UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT;

    /* Encode the content */
    UA_StatusCode retval = Byte_encodeBinary(&encoding, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_LOCALE)
        retval |= String_encodeBinary(&src->locale, NULL);
    if(encoding & UA_LOCALIZEDTEXT_ENCODINGMASKTYPE_TEXT)
        retval |= String_encodeBinary(&src->text, NULL);
    return retval;
}